

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall Player::fortify(Player *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  PlayerStrategy *pPVar4;
  ostream *poVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  size_type sVar7;
  reference ppCVar8;
  bool local_c9;
  Country *countryToFortify;
  int local_7c;
  value_type pCStack_78;
  int failsafeCounter;
  Country *fromCountry;
  int local_58;
  int local_54;
  int failsafeCounter_1;
  int numArmies;
  int ctryToFortIndex;
  int fromCountryIndex;
  char playerChoice;
  string local_38;
  Player *local_18;
  Player *this_local;
  
  local_18 = this;
  setPlayerState(this,FORTIFYING);
  notifyAll(this);
  pPVar4 = getStrategy(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_38,pPVar4);
  bVar1 = std::operator==(&local_38,"CHEATER");
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    pPVar4 = getStrategy(this);
    iVar2 = (**pPVar4->_vptr_PlayerStrategy)(pPVar4,6);
    this_local._4_4_ = (int)(char)iVar2;
  }
  else {
    ctryToFortIndex._3_1_ = '\0';
    numArmies = -1;
    failsafeCounter_1 = -1;
    local_54 = -1;
    do {
      std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
      poVar5 = std::operator<<((ostream *)&std::cout,"\n[PLAYER ");
      iVar2 = getPlayerId(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::operator<<(poVar5,"] Do you wish to fortify a country this turn (y/n)? ");
      iVar2 = (**this->strategy->_vptr_PlayerStrategy)();
      ctryToFortIndex._3_1_ = (char)iVar2;
      if ((ctryToFortIndex._3_1_ != 'y') && (ctryToFortIndex._3_1_ != 'n')) {
        std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
      }
      local_c9 = ctryToFortIndex._3_1_ != 'y' && ctryToFortIndex._3_1_ != 'n';
    } while (local_c9);
    if (ctryToFortIndex._3_1_ == 'y') {
      poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
      iVar2 = getPlayerId(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5," has chosen to fortify!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_58 = 0;
      do {
        if (9 < local_58) {
          std::operator<<((ostream *)&std::cout,
                          "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
          setPlayerState(this,IDLE);
          (*this->strategy->_vptr_PlayerStrategy[5])();
          return 0;
        }
        local_58 = local_58 + 1;
        std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
        pvVar6 = getOwnedCountries(this);
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
                  ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&fromCountry,pvVar6);
        showCountries((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&fromCountry);
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector
                  ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&fromCountry);
        poVar5 = std::operator<<((ostream *)&std::cout,"\nYou own ");
        pvVar6 = getOwnedCountries(this);
        sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
        poVar5 = std::operator<<(poVar5,
                                 " countries. Which country do you want to move armies from ? (choose 0 to "
                                );
        pvVar6 = getOwnedCountries(this);
        sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7 - 1);
        std::operator<<(poVar5," ) ");
        iVar2 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,7);
        numArmies = iVar2;
        if (iVar2 < 0) {
LAB_00117ed2:
          std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
        }
        else {
          pvVar6 = getOwnedCountries(this);
          sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
          if ((int)sVar7 + -1 < iVar2) goto LAB_00117ed2;
          pvVar6 = getOwnedCountries(this);
          ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pvVar6,(long)numArmies);
          iVar2 = Map::Country::getNumberOfTroops(*ppCVar8);
          if (iVar2 < 2) goto LAB_00117ed2;
        }
        iVar2 = numArmies;
        bVar1 = true;
        if (-1 < numArmies) {
          pvVar6 = getOwnedCountries(this);
          sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
          bVar1 = true;
          if (iVar2 <= (int)sVar7 + -1) {
            pvVar6 = getOwnedCountries(this);
            ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                                (pvVar6,(long)numArmies);
            iVar2 = Map::Country::getNumberOfTroops(*ppCVar8);
            bVar1 = iVar2 < 2;
          }
        }
      } while (bVar1);
      pvVar6 = getOwnedCountries(this);
      ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (pvVar6,(long)numArmies);
      pCStack_78 = *ppCVar8;
      local_7c = 0;
      do {
        if (9 < local_7c) {
          std::operator<<((ostream *)&std::cout,
                          "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
          return -1;
        }
        local_7c = local_7c + 1;
        poVar5 = std::operator<<((ostream *)&std::cout,"\nCountry ");
        Map::Country::getCountryName_abi_cxx11_((string *)&countryToFortify,pCStack_78);
        poVar5 = std::operator<<(poVar5,(string *)&countryToFortify);
        poVar5 = std::operator<<(poVar5," has ");
        pvVar6 = Map::Country::getAdjCountries(pCStack_78);
        sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
        poVar5 = std::operator<<(poVar5," neighbours");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&countryToFortify);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Which of YOUR countries would you like to move your armies to ? (0 to "
                                );
        pvVar6 = Map::Country::getAdjCountries(pCStack_78);
        sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7 - 1);
        std::operator<<(poVar5,") ");
        iVar2 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,8);
        failsafeCounter_1 = iVar2;
        if (iVar2 < 0) {
LAB_001181c9:
          std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
        }
        else {
          pvVar6 = Map::Country::getAdjCountries(pCStack_78);
          sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
          if ((int)sVar7 + -1 < iVar2) goto LAB_001181c9;
          iVar2 = getPlayerId(this);
          pvVar6 = Map::Country::getAdjCountries(pCStack_78);
          ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pvVar6,(long)failsafeCounter_1);
          iVar3 = Map::Country::getPlayerOwnerID(*ppCVar8);
          if (iVar2 != iVar3) {
LAB_00118250:
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "\nEither you don\'t own this country or the country has no neighbours.\n"
                                    );
            poVar5 = std::operator<<(poVar5,"Skip turn.\n");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            return -1;
          }
          pvVar6 = Map::Country::getAdjCountries(pCStack_78);
          bVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::empty(pvVar6);
          if (bVar1) goto LAB_00118250;
        }
        iVar2 = failsafeCounter_1;
        bVar1 = true;
        if (-1 < failsafeCounter_1) {
          pvVar6 = Map::Country::getAdjCountries(pCStack_78);
          sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
          bVar1 = true;
          if (iVar2 <= (int)sVar7 + -1) {
            iVar2 = getPlayerId(this);
            pvVar6 = Map::Country::getAdjCountries(pCStack_78);
            ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                                (pvVar6,(long)failsafeCounter_1);
            iVar3 = Map::Country::getPlayerOwnerID(*ppCVar8);
            bVar1 = iVar2 != iVar3;
          }
        }
      } while (bVar1);
      do {
        poVar5 = std::operator<<((ostream *)&std::cout,"\nYou have ");
        iVar2 = Map::Country::getNumberOfTroops(pCStack_78);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5," armies in this country.");
        poVar5 = std::operator<<(poVar5," How many would you like to move ? (0 to ");
        iVar2 = Map::Country::getNumberOfTroops(pCStack_78);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 + -1);
        std::operator<<(poVar5,") ");
        iVar2 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,9);
        local_54 = iVar2;
        if ((iVar2 < 0) || (iVar3 = Map::Country::getNumberOfTroops(pCStack_78), iVar3 + -1 < iVar2)
           ) {
          std::operator<<((ostream *)&std::cout,"\nInvalid input. Try again.\n");
        }
        iVar2 = local_54;
        bVar1 = true;
        if (-1 < local_54) {
          iVar3 = Map::Country::getNumberOfTroops(pCStack_78);
          bVar1 = iVar3 + -1 < iVar2;
        }
      } while (bVar1);
      pvVar6 = Map::Country::getAdjCountries(pCStack_78);
      ppCVar8 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (pvVar6,(long)failsafeCounter_1);
      this_local._4_4_ = executeFortify(this,pCStack_78,*ppCVar8,local_54);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
      iVar2 = getPlayerId(this);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5," has chosen NOT to fortify!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      setPlayerState(this,IDLE);
      (*this->strategy->_vptr_PlayerStrategy[5])();
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Player::fortify() {

    this->setPlayerState(PlayerState::FORTIFYING);
    this->notifyAll();
    if (this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::FORTIFY);
    }

    char playerChoice = 0;
    int fromCountryIndex = -1;
    int ctryToFortIndex = -1;
    int numArmies = -1;
    do {
        std::cin.clear();
        std::cout << "\n[PLAYER " << this->getPlayerId() << "] Do you wish to fortify a country this turn (y/n)? ";
        playerChoice = strategy->yesOrNo(StrategyContext::FORTIFY);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (playerChoice != 'y' && playerChoice != 'n');

    if (playerChoice == 'y') {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to fortify!" << std::endl;
        int failsafeCounter = 0;
        do {
            //avoid infinite loops in case of bot malfunction or human delaying the game
            if(failsafeCounter >= 10){
                std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
                this->setPlayerState(PlayerState::IDLE);
                this->strategy->resetChoices();
                return PlayerAction::ABORTED;
            }
            failsafeCounter++;

            std::cin.clear();
            showCountries(*this->getOwnedCountries());
            std::cout << "\nYou own " << this->getOwnedCountries()->size()
                      << " countries. Which country do you want to move armies from ? (choose 0 to "
                      << this->getOwnedCountries()->size() - 1 << " ) ";
            fromCountryIndex = strategy->intInput(StrategyContext::FORTIFY_FROM_COUNTRY);
            //new condition
            if (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1) {
                std::cout << "\nInvalid input. Try again.\n";
                continue;
            }
            //new condition
        } while (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                 this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1);
    } else {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to fortify!" << std::endl;
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::ABORTED;
    }
    Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            return -1;
        }
        failsafeCounter++;
        std::cout << "\nCountry " << fromCountry->getCountryName() << " has " << fromCountry->getAdjCountries()->size() << " neighbours" << std::endl;
        std::cout << "Which of YOUR countries would you like to move your armies to ? (0 to " << fromCountry->getAdjCountries()->size() - 1 << ") ";

        ctryToFortIndex = strategy->intInput(StrategyContext::FORTIFY_TO_COUNTRY);

        if (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
        if (getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID() ||
            fromCountry->getAdjCountries()->empty()) {
            std::cout << "\nEither you don't own this country or the country has no neighbours.\n"
                      << "Skip turn.\n" << std::endl;
            return -1;
        }
    } while (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1 ||
             getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID());

    do {
        std::cout << "\nYou have " << fromCountry->getNumberOfTroops() << " armies in this country."
                  << " How many would you like to move ? (0 to " << fromCountry->getNumberOfTroops() - 1 << ") ";
        numArmies = strategy->intInput(StrategyContext::FORTIFY_ARMY_COUNT);
        if (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1);

    Map::Country *countryToFortify = fromCountry->getAdjCountries()->at(ctryToFortIndex);

    return this->executeFortify(*fromCountry, *countryToFortify, numArmies);
}